

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyHashInit(SyHash *pHash,SyMemBackend *pAllocator,ProcHash xHash,ProcCmp xCmp)

{
  SyHashEntry_Pr **pSrc;
  ProcCmp local_48;
  ProcHash local_40;
  SyHashEntry_Pr **apNew;
  ProcCmp xCmp_local;
  ProcHash xHash_local;
  SyMemBackend *pAllocator_local;
  SyHash *pHash_local;
  
  pSrc = (SyHashEntry_Pr **)SyMemBackendAlloc(pAllocator,0x80);
  if (pSrc == (SyHashEntry_Pr **)0x0) {
    pHash_local._4_4_ = -1;
  }
  else {
    SyZero(pSrc,0x80);
    pHash->pAllocator = pAllocator;
    local_40 = xHash;
    if (xHash == (ProcHash)0x0) {
      local_40 = SyBinHash;
    }
    pHash->xHash = local_40;
    local_48 = xCmp;
    if (xCmp == (ProcCmp)0x0) {
      local_48 = SyMemcmp;
    }
    pHash->xCmp = local_48;
    pHash->pList = (SyHashEntry_Pr *)0x0;
    pHash->pCurrent = (SyHashEntry_Pr *)0x0;
    pHash->nEntry = 0;
    pHash->apBucket = pSrc;
    pHash->nBucketSize = 0x10;
    pHash_local._4_4_ = 0;
  }
  return pHash_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SyHashInit(SyHash *pHash, SyMemBackend *pAllocator, ProcHash xHash, ProcCmp xCmp)
{
	SyHashEntry_Pr **apNew;
#if defined(UNTRUST)
	if( pHash == 0 ){
		return SXERR_EMPTY;
	}
#endif
	/* Allocate a new table */
	apNew = (SyHashEntry_Pr **)SyMemBackendAlloc(&(*pAllocator), sizeof(SyHashEntry_Pr *) * SXHASH_BUCKET_SIZE);
	if( apNew == 0 ){
		return SXERR_MEM;
	}
	SyZero((void *)apNew, sizeof(SyHashEntry_Pr *) * SXHASH_BUCKET_SIZE);
	pHash->pAllocator = &(*pAllocator);
	pHash->xHash = xHash ? xHash : SyBinHash;
	pHash->xCmp = xCmp ? xCmp : SyMemcmp;
	pHash->pCurrent = pHash->pList = 0;
	pHash->nEntry = 0;
	pHash->apBucket = apNew;
	pHash->nBucketSize = SXHASH_BUCKET_SIZE;
	return SXRET_OK;
}